

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
* toml::detail::parse_comment_line<toml::type_config>
            (result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  char *pcVar1;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var2;
  element_type *peVar3;
  long lVar4;
  pointer puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined8 uVar7;
  char *pcVar8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  char *in_R9;
  scanner_storage *other;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  location first;
  region com_reg;
  undefined1 local_300 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0 [4];
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  _Alloc_hider local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [32];
  size_t *local_220;
  size_t local_210 [2];
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  undefined1 local_1e0;
  location local_1d8;
  region local_190;
  character local_128;
  literal local_118;
  source_location local_100;
  failure<toml::error_info> local_88;
  
  location::location(&local_1d8,loc);
  skip_whitespace<toml::type_config>(loc,ctx);
  syntax::comment((sequence *)local_300,&ctx->toml_spec_);
  sequence::scan(&local_190,(sequence *)local_300,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_300 + 8));
  if (local_190.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    (loc->source_).
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_1d8.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(loc->source_).
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &local_1d8.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&loc->source_name_,&local_1d8.source_name_);
    loc->column_number_ = local_1d8.column_number_;
    loc->location_ = local_1d8.location_;
    loc->line_number_ = local_1d8.line_number_;
    __return_storage_ptr__->is_ok_ = true;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    goto LAB_00359439;
  }
  last._M_current =
       (uchar *)(loc->source_).
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(((element_type *)last._M_current)->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(((element_type *)last._M_current)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start)) {
    local_128.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cf8f0;
    local_128.value_ = '\n';
    local_118.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cfa08;
    local_118.value_ = "\r\n";
    local_118.size_ = 2;
    either::either<toml::detail::character,toml::detail::literal>
              ((either *)local_298,&local_128,&local_118);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ != p_Var6) {
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_;
      do {
        _Var2._M_head_impl =
             (((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                *)&p_Var12->_vptr__Sp_counted_base)->_M_t).
             super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
             .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
        (*(_Var2._M_head_impl)->_vptr_scanner_base[2])((region *)local_300,_Var2._M_head_impl,loc);
        uVar7 = local_300._0_8_;
        region::~region((region *)local_300);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar7 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)(local_298 + 8));
          goto LAB_003592d4;
        }
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var12->_M_use_count;
      } while (p_Var12 != p_Var6);
    }
    region::region((region *)local_300);
    uVar7 = local_300._0_8_;
    region::~region((region *)local_300);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_298 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      peVar3 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      pcVar11 = (char *)loc->location_;
      lVar4 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      pcVar8 = (char *)((peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish + -lVar4);
      if (pcVar11 < pcVar8) {
        sVar9 = loc->line_number_;
        sVar10 = loc->column_number_;
        do {
          pcVar1 = pcVar11 + 1;
          if (pcVar1 < pcVar8) {
            if (pcVar11[lVar4] == '\n') {
              sVar9 = sVar9 + 1;
              loc->line_number_ = sVar9;
              sVar10 = 1;
            }
            else {
              sVar10 = sVar10 + 1;
            }
            loc->column_number_ = sVar10;
            loc->location_ = (size_t)pcVar1;
            if (pcVar1[lVar4] != '\n') goto LAB_0035926f;
            if (pcVar11 + 2 < pcVar8) {
              if (pcVar1[lVar4] == '\n') {
                loc->line_number_ = sVar9 + 1;
                sVar10 = 1;
              }
              else {
                sVar10 = sVar10 + 1;
              }
              loc->column_number_ = sVar10;
              pcVar8 = pcVar11 + 2;
            }
            else if (pcVar8 != pcVar1) {
              pcVar11 = pcVar11 + 1;
              do {
                if (pcVar11[lVar4] == '\n') {
                  sVar9 = sVar9 + 1;
                  loc->line_number_ = sVar9;
                  sVar10 = 1;
                }
                else {
                  sVar10 = sVar10 + 1;
                }
                loc->column_number_ = sVar10;
                pcVar11 = pcVar11 + 1;
              } while (pcVar8 != pcVar11);
            }
            loc->location_ = (size_t)pcVar8;
            in_R9 = pcVar8;
            break;
          }
          do {
            if (pcVar11[lVar4] == '\n') {
              sVar9 = sVar9 + 1;
              loc->line_number_ = sVar9;
              sVar10 = 1;
            }
            else {
              sVar10 = sVar10 + 1;
            }
            loc->column_number_ = sVar10;
            pcVar11 = pcVar11 + 1;
          } while (pcVar8 != pcVar11);
          loc->location_ = (size_t)pcVar8;
          pcVar1 = pcVar8;
LAB_0035926f:
          pcVar11 = pcVar1;
        } while (pcVar11 < pcVar8);
      }
      local_220 = local_210;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_220,
                 "toml::parse_comment_line: newline (LF / CRLF) or EOF is expected","");
      region::region((region *)local_300,loc);
      source_location::source_location(&local_100,(region *)local_300);
      local_240._0_8_ = local_240 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"but got this","");
      make_error_info<char_const(&)[65]>
                ((error_info *)local_298,(toml *)&local_220,(string *)&local_100,
                 (source_location *)local_240,
                 (string *)"Hint: most of the control characters are not allowed in comments",
                 (char (*) [65])in_R9);
      err<toml::error_info>(&local_88,(error_info *)local_298);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
      failure<toml::error_info>::~failure(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_p != &local_250) {
        operator_delete(local_260._M_p,local_250._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,
                        CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) +
                        1);
      }
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
      }
      source_location::~source_location(&local_100);
      region::~region((region *)local_300);
      if (local_220 != local_210) {
        operator_delete(local_220,local_210[0] + 1);
      }
      goto LAB_00359439;
    }
LAB_003592d4:
    if (local_190.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) goto LAB_003592e1;
    local_298._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_288._M_local_buf[0] = '\0';
LAB_0035934b:
    local_298._0_8_ = &local_2f0;
    local_2f0._M_allocated_capacity =
         CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]);
    local_2f0._8_8_ = local_288._8_8_;
  }
  else {
LAB_003592e1:
    puVar5 = ((local_190.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)local_298,(detail *)(puVar5 + local_190.first_),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar5 + local_190.last_),last);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ == &local_288) goto LAB_0035934b;
    local_2f0._M_allocated_capacity =
         CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]);
  }
  uVar7 = local_298._8_8_;
  local_1f0._M_allocated_capacity = local_2f0._M_allocated_capacity;
  local_300._0_8_ = &local_2f0;
  local_300._8_8_ = local_298._8_8_;
  local_298._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_288._M_local_buf[0] = '\0';
  local_2e0[0]._M_local_buf[0] = '\x01';
  if (local_298._0_8_ == local_300._0_8_) {
    local_300._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2f0._M_allocated_capacity = (ulong)(uint7)local_2f0._M_allocated_capacity._1_7_ << 8;
    local_1f0._8_8_ = local_2f0._8_8_;
    __return_storage_ptr__->is_ok_ = true;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    (__return_storage_ptr__->field_1).fail_.value.title_._M_dataplus._M_p =
         (pointer)((long)&__return_storage_ptr__->field_1 + 0x10);
LAB_00359407:
    *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_1f0._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail_.value.title_.field_2 + 8) =
         local_1f0._8_8_;
  }
  else {
    local_2f0._M_allocated_capacity = (ulong)(uint7)local_2f0._M_allocated_capacity._1_7_ << 8;
    __return_storage_ptr__->is_ok_ = true;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    (__return_storage_ptr__->field_1).fail_.value.title_._M_dataplus._M_p =
         (pointer)((long)&__return_storage_ptr__->field_1 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ == &local_1f0) goto LAB_00359407;
    (__return_storage_ptr__->field_1).fail_.value.title_._M_dataplus._M_p = (pointer)local_298._0_8_
    ;
    *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_1f0._M_allocated_capacity;
  }
  local_200._M_p = (pointer)&local_1f0;
  (__return_storage_ptr__->field_1).fail_.value.title_._M_string_length = uVar7;
  local_1f8 = 0;
  local_1f0._M_allocated_capacity = local_1f0._M_allocated_capacity & 0xffffffffffffff00;
  *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 1;
  local_1e0 = 0;
  local_298._0_8_ = &local_288;
LAB_00359439:
  region::~region(&local_190);
  location::~location(&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

result<cxx::optional<std::string>, error_info>
parse_comment_line(location& loc, context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    const auto first = loc;

    skip_whitespace(loc, ctx);

    const auto com_reg = syntax::comment(spec).scan(loc);
    if(com_reg.is_ok())
    {
        // once comment started, newline must follow (or reach EOF).
        if( ! loc.eof() && ! syntax::newline(spec).scan(loc).is_ok())
        {
            while( ! loc.eof()) // skip until newline to continue parsing
            {
                loc.advance();
                if(loc.current() == '\n') { /*skip LF*/ loc.advance(); break; }
            }
            return err(make_error_info("toml::parse_comment_line: "
                "newline (LF / CRLF) or EOF is expected",
                source_location(region(loc)), "but got this",
                "Hint: most of the control characters are not allowed in comments"));
        }
        return ok(cxx::optional<std::string>(com_reg.as_string()));
    }
    else
    {
        loc = first; // rollback whitespace to parse indent
        return ok(cxx::optional<std::string>(cxx::make_nullopt()));
    }
}